

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.c
# Opt level: O3

Ray * perspective_camera_ray(Ray *__return_storage_ptr__,PerspectiveCamera cam,float sx,float sy)

{
  undefined1 auVar1 [16];
  float fVar2;
  float in_XMM0_Db;
  float in_XMM1_Db;
  undefined1 auVar3 [16];
  Vec3 VVar4;
  Vec3 v;
  
  VVar4.z = -cam.depth;
  VVar4.x = (sx + sx + -1.0) * cam.xscale;
  VVar4.y = (sy + sy + -1.0) * cam.yscale;
  fVar2 = norm(VVar4);
  v.z = VVar4.z / fVar2;
  auVar1._4_4_ = VVar4.y;
  auVar1._0_4_ = VVar4.x;
  auVar1._8_4_ = (in_XMM0_Db + in_XMM0_Db + 0.0) * 0.0;
  auVar1._12_4_ = (in_XMM1_Db + in_XMM1_Db + 0.0) * 0.0;
  auVar3._4_4_ = fVar2;
  auVar3._0_4_ = fVar2;
  auVar3._8_4_ = fVar2;
  auVar3._12_4_ = fVar2;
  auVar3 = divps(auVar1,auVar3);
  (__return_storage_ptr__->o).x = cam.eye.x;
  (__return_storage_ptr__->o).y = cam.eye.y;
  (__return_storage_ptr__->o).z = cam.eye.z;
  v.x = (float)(int)auVar3._0_8_;
  v.y = (float)(int)((ulong)auVar3._0_8_ >> 0x20);
  VVar4 = basis2world(v,cam.basis[0],cam.basis[1],cam.basis[2]);
  (__return_storage_ptr__->d).x = (float)(int)VVar4._0_8_;
  (__return_storage_ptr__->d).y = (float)(int)((ulong)VVar4._0_8_ >> 0x20);
  (__return_storage_ptr__->d).z = VVar4.z;
  return __return_storage_ptr__;
}

Assistant:

Ray perspective_camera_ray(PerspectiveCamera cam, float sx, float sy) {
    Vec3 basis_ray = normalized(
        (Vec3){ cam.xscale * (-1.0f + 2.0f * sx),
                cam.yscale * (-1.0f + 2.0f * sy),
                -cam.depth
                }
        );
    Ray r = {
        .o = cam.eye,
        .d = basis2world(
            basis_ray,
            cam.basis[0], cam.basis[1], cam.basis[2]
            )
    };
    return r;
}